

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_iter.c
# Opt level: O3

int tnt_iter_reply_next(tnt_iter *i)

{
  tnt_reply *r;
  tnt_stream *ptVar1;
  int iVar2;
  uint uVar3;
  
  r = &(i->data).reply.r;
  tnt_reply_free(r);
  tnt_reply_init(r);
  ptVar1 = (i->data).reply.s;
  iVar2 = (*ptVar1->read_reply)(ptVar1,r);
  if (iVar2 == -1) {
    i->status = TNT_ITER_FAIL;
    uVar3 = 0;
  }
  else {
    uVar3 = (uint)(iVar2 != 1);
  }
  return uVar3;
}

Assistant:

static int tnt_iter_reply_next(struct tnt_iter *i) {
	struct tnt_iter_reply *ir = TNT_IREPLY(i);
	tnt_reply_free(&ir->r);
	tnt_reply_init(&ir->r);
	int rc = ir->s->read_reply(ir->s, &ir->r);
	if (rc == -1) {
		i->status = TNT_ITER_FAIL;
		return 0;
	}
	return (rc == 1 /* finish */ ) ? 0 : 1;
}